

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O0

void xLearn::CheckCSV(DMatrix *matrix,bool disk)

{
  bool bVar1;
  char *pcVar2;
  const_reference ppvVar3;
  byte in_SIL;
  long in_RDI;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  iterator iter;
  int n;
  SparseRow *row;
  int i;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  float in_stack_000001d8;
  undefined3 in_stack_000001dc;
  char *in_stack_000001e8;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffffe18;
  __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  *in_stack_fffffffffffffe20;
  AssertionResult *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  char *in_stack_fffffffffffffe38;
  AssertHelper local_138;
  Message local_130;
  undefined4 local_124;
  AssertionResult local_120;
  AssertHelper local_110;
  Message local_108;
  AssertionResult local_100;
  AssertHelper local_f0;
  Message local_e8;
  AssertionResult local_e0;
  Node *local_d0;
  __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_c8;
  int local_bc;
  value_type local_b8;
  uint local_ac;
  AssertHelper local_a8;
  Message local_a0;
  AssertionResult local_98;
  AssertHelper local_88;
  Message local_80;
  undefined4 local_74;
  AssertionResult local_70;
  AssertHelper local_60;
  Message local_58;
  AssertionResult local_50;
  AssertHelper local_40;
  Message local_38 [3];
  AssertionResult local_20;
  byte local_9;
  long local_8;
  
  local_9 = in_SIL & 1;
  local_8 = in_RDI;
  if (local_9 == 0) {
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              (in_stack_fffffffffffffe38,
               (char *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (uint *)in_stack_fffffffffffffe28,(uint *)in_stack_fffffffffffffe20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
    if (!bVar1) {
      testing::Message::Message(&local_58);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x151c6e);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/reader_test.cc"
                 ,0xc4,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::Message::~Message((Message *)0x151cd1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x151d26);
  }
  else {
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              (in_stack_fffffffffffffe38,
               (char *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (uint *)in_stack_fffffffffffffe28,(uint *)in_stack_fffffffffffffe20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
    if (!bVar1) {
      testing::Message::Message(local_38);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x151b0c);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/reader_test.cc"
                 ,0xc2,pcVar2);
      testing::internal::AssertHelper::operator=(&local_40,local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      testing::Message::~Message((Message *)0x151b6f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x151bc4);
  }
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)(local_8 + 0x30),0);
  local_74 = 0;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffffe38,
             (char *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
             (float *)in_stack_fffffffffffffe28,(int *)in_stack_fffffffffffffe20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x151dd9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/reader_test.cc"
               ,0xc6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message((Message *)0x151e36);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x151e8b);
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)(local_8 + 0x48),0);
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_000001e8,(char *)matrix,_in_stack_000001dc,in_stack_000001d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x151f32);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/reader_test.cc"
               ,199,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message((Message *)0x151f8f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x151fe7);
  for (local_ac = 0; local_ac < *(uint *)(local_8 + 0x10); local_ac = local_ac + 1) {
    ppvVar3 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(local_8 + 0x18),(long)(int)local_ac);
    local_b8 = *ppvVar3;
    local_bc = 0;
    local_c8._M_current =
         (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                           (in_stack_fffffffffffffe18);
    while( true ) {
      local_d0 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                   (in_stack_fffffffffffffe18);
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffe20,
                         (__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)in_stack_fffffffffffffe18);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_c8);
      testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                (in_stack_fffffffffffffe38,
                 (char *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                 (uint *)in_stack_fffffffffffffe28,(int *)in_stack_fffffffffffffe20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
      if (!bVar1) {
        testing::Message::Message(&local_e8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x152123);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/reader_test.cc"
                   ,0xcd,pcVar2);
        testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        testing::Message::~Message((Message *)0x152180);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1521d5);
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_c8);
      testing::internal::CmpHelperFloatingPointEQ<float>
                (in_stack_000001e8,(char *)matrix,_in_stack_000001dc,in_stack_000001d8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
      if (!bVar1) {
        testing::Message::Message(&local_108);
        in_stack_fffffffffffffe38 =
             testing::AssertionResult::failure_message((AssertionResult *)0x152275);
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/reader_test.cc"
                   ,0xce,in_stack_fffffffffffffe38);
        testing::internal::AssertHelper::operator=(&local_110,&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        testing::Message::~Message((Message *)0x1522d2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x152327);
      local_bc = local_bc + 1;
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator++(&local_c8);
    }
    local_124 = 3;
    in_stack_fffffffffffffe28 = &local_120;
    testing::internal::EqHelper<false>::Compare<int,int>
              (in_stack_fffffffffffffe38,
               (char *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (int *)in_stack_fffffffffffffe28,(int *)in_stack_fffffffffffffe20);
    in_stack_fffffffffffffe37 =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffe28);
    if (!(bool)in_stack_fffffffffffffe37) {
      testing::Message::Message(&local_130);
      in_stack_fffffffffffffe20 =
           (__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0x1523eb);
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/reader_test.cc"
                 ,0xd1,(char *)in_stack_fffffffffffffe20);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      testing::Message::~Message((Message *)0x152448);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x15249d);
  }
  return;
}

Assistant:

void CheckCSV(const DMatrix* matrix, bool disk) {
  if (disk) {
    EXPECT_EQ(matrix->row_length, kNumLines);
  } else {
    EXPECT_EQ(matrix->row_length, kNumLines);
  }
  EXPECT_EQ(matrix->Y[0], 0);
  EXPECT_FLOAT_EQ(matrix->norm[0], 22.03274);
  for (int i = 0; i < matrix->row_length; ++i) {
    SparseRow *row = matrix->row[i];
    int n = 0;
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      EXPECT_EQ(iter->feat_id, n);
      EXPECT_FLOAT_EQ(iter->feat_val, 0.123);
      n++;
    }
    EXPECT_EQ(n, 3);
  }
}